

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O3

void __thiscall RegexTree::firstpos(RegexTree *this,tree_node *ptr,StateSet *s)

{
  tree_node *ptr_00;
  char cVar1;
  bool bVar2;
  StateSet *extraout_RDX;
  StateSet *s_00;
  StateSet *extraout_RDX_00;
  __hashtable *__h;
  RegexTree *pRVar3;
  pair<std::__detail::_Node_iterator<const_tree_node_*,_true,_false>,_bool> pVar4;
  __node_gen_type __node_gen;
  RegexTree *local_28;
  tree_node *local_20;
  
  if (this == (RegexTree *)0x0) {
    return;
  }
  cVar1 = *(char *)&this[2].root;
  if (cVar1 == '\a') {
    return;
  }
  local_28 = this;
  if ((this->root == (tree_node *)0x0) && (this[1].root == (tree_node *)0x0)) {
    local_20 = ptr;
    pVar4 = std::
            _Hashtable<tree_node_const*,tree_node_const*,std::allocator<tree_node_const*>,std::__detail::_Identity,std::equal_to<tree_node_const*>,std::hash<tree_node_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<tree_node_const*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<tree_node_const*,false>>>>
                      ((_Hashtable<tree_node_const*,tree_node_const*,std::allocator<tree_node_const*>,std::__detail::_Identity,std::equal_to<tree_node_const*>,std::hash<tree_node_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)ptr,&local_28);
    s = pVar4._8_8_;
    cVar1 = *(char *)&local_28[2].root;
  }
  if (cVar1 == '\b') {
    ptr_00 = local_28->root;
    bVar2 = nullable(ptr_00);
    firstpos((RegexTree *)ptr_00,ptr,s_00);
    s = extraout_RDX_00;
    if (!bVar2) {
      return;
    }
  }
  else {
    pRVar3 = local_28;
    if (cVar1 == '\t') goto LAB_00103991;
    if (cVar1 != '\n') {
      return;
    }
    firstpos((RegexTree *)local_28->root,ptr,s);
    s = extraout_RDX;
  }
  pRVar3 = local_28 + 1;
LAB_00103991:
  firstpos((RegexTree *)pRVar3->root,ptr,s);
  return;
}

Assistant:

void RegexTree::firstpos(const tree_node *ptr, RegexTree::StateSet &s) {
    if (ptr == nullptr || ptr->c == EPSILON) return;
    if (ptr->left == nullptr && ptr->right == nullptr)
        s.insert(ptr);
    if (ptr->c == OR) {
        firstpos(ptr->left, s);
        firstpos(ptr->right, s);
        return;
    }
    if (ptr->c == CAT) {
        if (nullable(ptr->left)) {
            firstpos(ptr->left, s);
            firstpos(ptr->right, s);
        } else
            firstpos(ptr->left, s);
        return;
    }
    if (ptr->c == STAR)
        firstpos(ptr->left, s);
}